

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

commitments_t * allocateCommitments(picnic_instance_t *params,size_t numCommitments)

{
  commitments_t *pcVar1;
  ulong in_RSI;
  long in_RDI;
  uint32_t j;
  uint32_t i;
  uint8_t *slab;
  commitments_t *commitments;
  ulong local_30;
  uint local_28;
  uint local_24;
  uint8_t **local_20;
  
  pcVar1 = (commitments_t *)malloc((ulong)*(ushort *)(in_RDI + 4) << 4);
  local_30 = in_RSI;
  if (in_RSI == 0) {
    local_30 = (ulong)*(byte *)(in_RDI + 0xb);
  }
  pcVar1->nCommitments = local_30;
  local_20 = (uint8_t **)
             malloc((ulong)*(ushort *)(in_RDI + 4) *
                    (pcVar1->nCommitments * (ulong)*(byte *)(in_RDI + 6) + pcVar1->nCommitments * 8)
                   );
  for (local_24 = 0; local_24 < *(ushort *)(in_RDI + 4); local_24 = local_24 + 1) {
    pcVar1[local_24].hashes = local_20;
    local_20 = local_20 + pcVar1->nCommitments;
    for (local_28 = 0; (ulong)local_28 < pcVar1->nCommitments; local_28 = local_28 + 1) {
      pcVar1[local_24].hashes[local_28] = (uint8_t *)local_20;
      local_20 = (uint8_t **)((long)local_20 + (long)(int)(uint)*(byte *)(in_RDI + 6));
    }
  }
  return pcVar1;
}

Assistant:

commitments_t* allocateCommitments(const picnic_instance_t* params, size_t numCommitments) {
  commitments_t* commitments = malloc(params->num_rounds * sizeof(commitments_t));

  commitments->nCommitments = numCommitments ? numCommitments : params->num_MPC_parties;

  uint8_t* slab = malloc(params->num_rounds * (commitments->nCommitments * params->digest_size +
                                               commitments->nCommitments * sizeof(uint8_t*)));

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    commitments[i].hashes = (uint8_t**)slab;
    slab += commitments->nCommitments * sizeof(uint8_t*);

    for (uint32_t j = 0; j < commitments->nCommitments; j++) {
      commitments[i].hashes[j] = slab;
      slab += params->digest_size;
    }
  }

  return commitments;
}